

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs_impl::any,_std::allocator>::destroy
          (stack_type<cs_impl::any,_std::allocator> *this)

{
  any *paVar1;
  
  paVar1 = this->m_current;
  while (paVar1 != this->m_start) {
    this->m_current = paVar1 + -1;
    cs_impl::any::recycle(paVar1 + -1);
    paVar1 = this->m_current;
  }
  operator_delete(this->m_data,this->m_size << 3);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}